

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O3

int light_close_stream(light_pcapng_stream pcapng)

{
  if (pcapng != (light_pcapng_stream)0x0) {
    if (pcapng->current_block != (light_pcapng)0x0) {
      light_pcapng_release(pcapng->current_block);
      pcapng->current_block = (_light_pcapng *)0x0;
    }
    light_close((pcapng->stream).fd);
    free(pcapng);
    return 0;
  }
  return -5;
}

Assistant:

int light_close_stream(light_pcapng_stream pcapng)
{
	if (pcapng == NULL) {
		return LIGHT_BAD_STREAM;
	}

	if (pcapng->current_block) {
		light_pcapng_release(pcapng->current_block);
		pcapng->current_block = NULL;
	}

	light_close(pcapng->stream.fd);
	pcapng->valid = 0;
	free(pcapng);

	return LIGHT_SUCCESS;
}